

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# locdspnm.cpp
# Opt level: O1

LocaleDisplayNames *
icu_63::LocaleDisplayNames::createInstance(Locale *locale,UDisplayContext *contexts,int32_t length)

{
  LocaleDisplayNamesImpl *this;
  
  this = (LocaleDisplayNamesImpl *)UMemory::operator_new((UMemory *)0x4b8,(size_t)contexts);
  if (this == (LocaleDisplayNamesImpl *)0x0) {
    this = (LocaleDisplayNamesImpl *)0x0;
  }
  else {
    if (contexts == (UDisplayContext *)0x0) {
      length = 0;
    }
    LocaleDisplayNamesImpl::LocaleDisplayNamesImpl(this,locale,contexts,length);
  }
  return &this->super_LocaleDisplayNames;
}

Assistant:

LocaleDisplayNames*
LocaleDisplayNames::createInstance(const Locale& locale,
                                   UDisplayContext *contexts, int32_t length) {
    if (contexts == NULL) {
        length = 0;
    }
    return new LocaleDisplayNamesImpl(locale, contexts, length);
}